

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O2

void __thiscall booster::regex::regex(regex *this)

{
  data *pdVar1;
  
  pdVar1 = (data *)operator_new(0x50);
  (pdVar1->expression)._M_dataplus._M_p = (pointer)&(pdVar1->expression).field_2;
  (pdVar1->expression)._M_string_length = 0;
  (pdVar1->expression).field_2._M_local_buf[0] = '\0';
  pdVar1->flags = 0;
  pdVar1->re = (pcre *)0x0;
  pdVar1->are = (pcre *)0x0;
  pdVar1->re_size = 0;
  pdVar1->are_size = 0;
  pdVar1->match_size = 0;
  (this->d).ptr_ = pdVar1;
  return;
}

Assistant:

regex::regex() : d(new data()) 
	{
	}